

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O2

uint __thiscall UnifiedRegex::CharSet<char16_t>::Count(CharSet<char16_t> *this)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined **ppuVar8;
  
  pCVar1 = (this->rep).full.root;
  if ((undefined1 *)((long)&pCVar1[-1]._vptr_CharSetNode + 7U) < (undefined1 *)0x5) {
    uVar4 = (int)pCVar1 - 1;
  }
  else {
    if (pCVar1 == (CharSetNode *)0x0) {
      uVar4 = CharBitvec::Count(&(this->rep).full.direct);
      return uVar4;
    }
    ppuVar8 = &CharSetFull::Instance;
    if (pCVar1 != (CharSetNode *)&CharSetFull::Instance) {
      uVar5 = (*pCVar1->_vptr_CharSetNode[0xb])(pCVar1,2);
      if (0xff00 < uVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x252,
                           "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                           ,
                           "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      ppuVar8 = (undefined **)(this->rep).full.root;
    }
    uVar4 = CharBitvec::Count(&(this->rep).full.direct);
    if (ppuVar8 == &CharSetFull::Instance) {
      iVar6 = 0xff00;
    }
    else {
      iVar6 = (*((CharSetNode *)ppuVar8)->_vptr_CharSetNode[0xb])(ppuVar8,2);
    }
    uVar4 = iVar6 + uVar4;
  }
  return uVar4;
}

Assistant:

inline uint Count() const
        {
            if (IsCompact())
            {
                return (uint)rep.compact.countPlusOne - 1;
            }
            else if (rep.full.root == 0)
            {
                return rep.full.direct.Count();
            }
            else
            {
                //The bit vector
                Assert(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00);
                return rep.full.direct.Count() + (rep.full.root == CharSetFull::TheFullNode ? 0xFF00 : rep.full.root->Count(CharSetNode::levels - 1));
            }
        }